

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr120r2500pro.cpp
# Opt level: O0

void IKSolver::polyroots4(IkReal *rawcoeffs,IkReal *rawroots,int *numroots)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  runtime_error *this;
  complex<double> *pcVar5;
  double dVar6;
  undefined8 extraout_XMM0_Qa;
  double dVar7;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined8 uVar8;
  complex<double> *local_3d8;
  complex<double> *local_3c0;
  int local_370;
  int local_36c;
  int j_2;
  int n;
  complex<double> newroot;
  int i_3;
  bool visited [4];
  int local_33c;
  undefined1 auStack_338 [4];
  int j_1;
  undefined8 local_330;
  undefined8 local_320;
  int local_314;
  undefined1 auStack_310 [4];
  int j;
  complex<double> x;
  int i_2;
  bool changed;
  int step;
  int local_2dc;
  undefined1 auStack_2d8 [4];
  int i_1;
  undefined8 local_2d0;
  IkReal local_2c8 [2];
  undefined8 local_2b8;
  IkReal err [4];
  complex<double> roots [4];
  complex<double> local_250;
  int local_240;
  undefined4 local_23c;
  int i;
  int maxsteps;
  complex<double> coeffs [4];
  IkReal tolsqrt;
  IkReal tol;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  int *local_20;
  int *numroots_local;
  IkReal *rawroots_local;
  IkReal *rawcoeffs_local;
  
  local_20 = numroots;
  numroots_local = (int *)rawroots;
  rawroots_local = rawcoeffs;
  if ((*rawcoeffs != 0.0) || (NAN(*rawcoeffs))) {
    if ((*rawcoeffs == 0.0) && (!NAN(*rawcoeffs))) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar4 = std::operator<<(local_198,"ikfast exception: ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Simon-Steinmann[P]ikfast_pybind_PR/src/kukakr120r2500pro/ikfast61_kukakr120r2500pro.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2629);
      poVar4 = std::operator<<(poVar4,": ");
      poVar4 = std::operator<<(poVar4,"polyroots4");
      poVar4 = std::operator<<(poVar4,": Assertion \'");
      poVar4 = std::operator<<(poVar4,"rawcoeffs[0] != 0");
      std::operator<<(poVar4,"\' failed");
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this,local_1d8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::numeric_limits<double>::epsilon();
    dVar6 = std::numeric_limits<double>::epsilon();
    dVar6 = sqrt(dVar6);
    local_3c0 = (complex<double> *)&i;
    do {
      std::complex<double>::complex(local_3c0,0.0,0.0);
      local_3c0 = local_3c0 + 1;
    } while (local_3c0 != (complex<double> *)(coeffs[3]._M_value + 8));
    local_23c = 0x6e;
    for (local_240 = 0; local_240 < 4; local_240 = local_240 + 1) {
      std::complex<double>::complex(&local_250,rawroots_local[local_240 + 1] / *rawroots_local,0.0);
      *(undefined8 *)(&i + (long)local_240 * 4) = local_250._M_value._0_8_;
      *(undefined8 *)coeffs[local_240]._M_value = local_250._M_value._8_8_;
    }
    local_3d8 = (complex<double> *)(err + 3);
    do {
      std::complex<double>::complex(local_3d8,0.0,0.0);
      local_3d8 = local_3d8 + 1;
    } while (local_3d8 != (complex<double> *)(roots[3]._M_value + 8));
    std::complex<double>::complex((complex<double> *)local_2c8,1.0,0.0);
    err[3] = local_2c8[0];
    roots[0]._M_value._0_8_ = local_2c8[1];
    uVar8 = 0x3feccccccccccccd;
    std::complex<double>::complex((complex<double> *)auStack_2d8,0.4,0.9);
    roots[0]._M_value._8_8_ = _auStack_2d8;
    roots[1]._M_value._0_8_ = local_2d0;
    local_2b8 = 0x3ff0000000000000;
    err[0] = 1.0;
    for (local_2dc = 2; local_2dc < 4; local_2dc = local_2dc + 1) {
      std::operator*((complex<double> *)(roots[(long)(local_2dc + -1) + -1]._M_value + 8),
                     (complex<double> *)(roots[0]._M_value + 8));
      *(undefined8 *)(roots[(long)local_2dc + -1]._M_value + 8) = extraout_XMM0_Qa;
      *(undefined8 *)roots[local_2dc]._M_value = uVar8;
      err[(long)local_2dc + -1] = 1.0;
    }
    for (i_2 = 0; i_2 < 0x6e; i_2 = i_2 + 1) {
      bVar2 = false;
      for (x._M_value._12_4_ = 0; (int)x._M_value._12_4_ < 4;
          x._M_value._12_4_ = x._M_value._12_4_ + 1) {
        uVar8 = 0x3d20000000000000;
        if (2.842170943040401e-14 <= err[(long)(int)x._M_value._12_4_ + -1]) {
          bVar2 = true;
          std::operator+((complex<double> *)(roots[(long)(int)x._M_value._12_4_ + -1]._M_value + 8),
                         (complex<double> *)&i);
          x._M_value._0_8_ = uVar8;
          for (local_314 = 1; local_314 < 4; local_314 = local_314 + 1) {
            uVar8 = x._M_value._0_8_;
            std::operator*((complex<double> *)
                           (roots[(long)(int)x._M_value._12_4_ + -1]._M_value + 8),
                           (complex<double> *)auStack_310);
            local_330 = uVar8;
            std::operator+((complex<double> *)auStack_338,
                           (complex<double> *)(&i + (long)local_314 * 4));
            local_320 = uVar8;
            x._M_value._0_8_ = uVar8;
          }
          for (local_33c = 0; local_33c < 4; local_33c = local_33c + 1) {
            if ((x._M_value._12_4_ != local_33c) &&
               (bVar3 = std::operator!=((complex<double> *)
                                        (roots[(long)(int)x._M_value._12_4_ + -1]._M_value + 8),
                                        (complex<double> *)
                                        (roots[(long)local_33c + -1]._M_value + 8)), bVar3)) {
              std::operator-((complex<double> *)
                             (roots[(long)(int)x._M_value._12_4_ + -1]._M_value + 8),
                             (complex<double> *)(roots[(long)local_33c + -1]._M_value + 8));
              std::complex<double>::operator/=
                        ((complex<double> *)auStack_310,(complex<double> *)&i_3);
            }
          }
          std::complex<double>::operator-=
                    ((complex<double> *)(roots[(long)(int)x._M_value._12_4_ + -1]._M_value + 8),
                     (complex<double> *)auStack_310);
          dVar7 = std::abs<double>((complex<double> *)auStack_310);
          err[(long)(int)x._M_value._12_4_ + -1] = dVar7;
        }
      }
      if (!bVar2) break;
    }
    *local_20 = 0;
    memset(newroot._M_value + 0xc,0,4);
    for (newroot._M_value._8_4_ = 0; (int)newroot._M_value._8_4_ < 4;
        newroot._M_value._8_4_ = newroot._M_value._8_4_ + 1) {
      if ((newroot._M_value[(long)(int)newroot._M_value._8_4_ + 0xc] & 1) == 0) {
        _j_2 = *(undefined8 *)(roots[(long)(int)newroot._M_value._8_4_ + -1]._M_value + 8);
        newroot._M_value._0_8_ = *(undefined8 *)roots[(int)newroot._M_value._8_4_]._M_value;
        local_36c = 1;
        local_370 = newroot._M_value._8_4_;
        while (local_370 = local_370 + 1, local_370 < 4) {
          std::real<double>((complex<double> *)
                            (roots[(long)(int)newroot._M_value._8_4_ + -1]._M_value + 8));
          pcVar5 = (complex<double> *)(roots[(long)local_370 + -1]._M_value + 8);
          std::real<double>(pcVar5);
          std::abs((int)pcVar5);
          if (extraout_XMM0_Qa_00 < dVar6) {
            std::imag<double>((complex<double> *)
                              (roots[(long)(int)newroot._M_value._8_4_ + -1]._M_value + 8));
            pcVar5 = (complex<double> *)(roots[(long)local_370 + -1]._M_value + 8);
            std::imag<double>(pcVar5);
            std::abs((int)pcVar5);
            if (extraout_XMM0_Qa_01 < 0.002) {
              std::complex<double>::operator+=
                        ((complex<double> *)&j_2,
                         (complex<double> *)(roots[(long)local_370 + -1]._M_value + 8));
              local_36c = local_36c + 1;
              newroot._M_value[(long)local_370 + 0xc] = 1;
            }
          }
        }
        if (1 < local_36c) {
          std::complex<double>::operator/=((complex<double> *)&j_2,(double)local_36c);
        }
        dVar7 = std::imag<double>((complex<double> *)&j_2);
        dVar7 = IKabs(dVar7);
        if (dVar7 < dVar6) {
          dVar7 = std::real<double>((complex<double> *)&j_2);
          iVar1 = *local_20;
          *local_20 = iVar1 + 1;
          *(double *)(numroots_local + (long)iVar1 * 2) = dVar7;
        }
      }
    }
  }
  else {
    polyroots3(rawcoeffs + 1,rawroots,numroots);
  }
  return;
}

Assistant:

static inline void polyroots4(IkReal rawcoeffs[4+1], IkReal rawroots[4], int& numroots)
{
    using std::complex;
    if( rawcoeffs[0] == 0 ) {
        // solve with one reduced degree
        polyroots3(&rawcoeffs[1], &rawroots[0], numroots);
        return;
    }
    IKFAST_ASSERT(rawcoeffs[0] != 0);
    const IkReal tol = 128.0*std::numeric_limits<IkReal>::epsilon();
    const IkReal tolsqrt = sqrt(std::numeric_limits<IkReal>::epsilon());
    complex<IkReal> coeffs[4];
    const int maxsteps = 110;
    for(int i = 0; i < 4; ++i) {
        coeffs[i] = complex<IkReal>(rawcoeffs[i+1]/rawcoeffs[0]);
    }
    complex<IkReal> roots[4];
    IkReal err[4];
    roots[0] = complex<IkReal>(1,0);
    roots[1] = complex<IkReal>(0.4,0.9); // any complex number not a root of unity works
    err[0] = 1.0;
    err[1] = 1.0;
    for(int i = 2; i < 4; ++i) {
        roots[i] = roots[i-1]*roots[1];
        err[i] = 1.0;
    }
    for(int step = 0; step < maxsteps; ++step) {
        bool changed = false;
        for(int i = 0; i < 4; ++i) {
            if ( err[i] >= tol ) {
                changed = true;
                // evaluate
                complex<IkReal> x = roots[i] + coeffs[0];
                for(int j = 1; j < 4; ++j) {
                    x = roots[i] * x + coeffs[j];
                }
                for(int j = 0; j < 4; ++j) {
                    if( i != j ) {
                        if( roots[i] != roots[j] ) {
                            x /= (roots[i] - roots[j]);
                        }
                    }
                }
                roots[i] -= x;
                err[i] = abs(x);
            }
        }
        if( !changed ) {
            break;
        }
    }

    numroots = 0;
    bool visited[4] = {false};
    for(int i = 0; i < 4; ++i) {
        if( !visited[i] ) {
            // might be a multiple root, in which case it will have more error than the other roots
            // find any neighboring roots, and take the average
            complex<IkReal> newroot=roots[i];
            int n = 1;
            for(int j = i+1; j < 4; ++j) {
                // care about error in real much more than imaginary
                if( abs(real(roots[i])-real(roots[j])) < tolsqrt && abs(imag(roots[i])-imag(roots[j])) < 0.002 ) {
                    newroot += roots[j];
                    n += 1;
                    visited[j] = true;
                }
            }
            if( n > 1 ) {
                newroot /= n;
            }
            // there are still cases where even the mean is not accurate enough, until a better multi-root algorithm is used, need to use the sqrt
            if( IKabs(imag(newroot)) < tolsqrt ) {
                rawroots[numroots++] = real(newroot);
            }
        }
    }
}